

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::dxt_hc::alpha_cluster>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint uVar1;
  void *p;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  void *pvVar5;
  byte bVar6;
  
  bVar6 = 0;
  if (num != 0) {
    pvVar5 = (void *)((ulong)num * 0x90 + (long)pSrc_void);
    do {
      lVar4 = 0;
      do {
        *(undefined8 *)((long)pDst_void + lVar4) = 0;
        ((undefined8 *)((long)pDst_void + lVar4))[1] = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)((long)pDst_void + lVar4),
                   *(uint *)((long)pSrc_void + lVar4 + 8),false,4,(object_mover)0x0,false);
        uVar1 = *(uint *)((long)pSrc_void + lVar4 + 8);
        *(uint *)((long)pDst_void + lVar4 + 8) = uVar1;
        memcpy(*(void **)((long)pDst_void + lVar4),*(void **)((long)pSrc_void + lVar4),
               (ulong)uVar1 << 2);
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x30);
      *(undefined8 *)((long)pDst_void + 0x30) = 0;
      *(undefined8 *)((long)pDst_void + 0x38) = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)((long)pDst_void + 0x30),*(uint *)((long)pSrc_void + 0x38),
                 false,4,(object_mover)0x0,false);
      uVar1 = *(uint *)((long)pSrc_void + 0x38);
      *(uint *)((long)pDst_void + 0x38) = uVar1;
      memcpy(*(void **)((long)pDst_void + 0x30),*(void **)((long)pSrc_void + 0x30),(ulong)uVar1 << 2
            );
      puVar2 = (undefined8 *)((long)pSrc_void + 0x40);
      puVar3 = (undefined8 *)((long)pDst_void + 0x40);
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar3 = *puVar2;
        puVar2 = puVar2 + (ulong)bVar6 * -2 + 1;
        puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      }
      *(undefined4 *)((long)pDst_void + 0x88) = *(undefined4 *)((long)pSrc_void + 0x88);
      if (*(void **)((long)pSrc_void + 0x30) != (void *)0x0) {
        crnlib_free(*(void **)((long)pSrc_void + 0x30));
      }
      lVar4 = 0x30;
      do {
        p = *(void **)((long)pSrc_void + lVar4 + -0x10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar4 = lVar4 + -0x10;
      } while (lVar4 != 0);
      pSrc_void = (void *)((long)pSrc_void + 0x90);
      pDst_void = (void *)((long)pDst_void + 0x90);
    } while (pSrc_void != pvVar5);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }